

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_fuse.hpp
# Opt level: O0

optional<unsigned_long> __thiscall
magic_enum::detail::fuse_enum<Color,Directions,Index>
          (detail *this,Color head,Directions tail,Index tail_1)

{
  optional<unsigned_long> oVar1;
  _Optional_base<unsigned_long,_true,_true> _Var2;
  optional<unsigned_long> hash;
  undefined4 local_30;
  Index tail_local_1;
  Directions tail_local;
  Color head_local;
  
  oVar1 = fuse_enum<Directions,Index>(head,tail);
  local_30 = CONCAT31(local_30._1_3_,
                      oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged);
  hash.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._4_4_ = 0;
  hash.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_4_ = local_30;
  hash.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_4_ = (int)this;
  hash.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 0;
  _Var2._M_payload.super__Optional_payload_base<unsigned_long> =
       (_Optional_payload<unsigned_long,_true,_true,_true>)
       fuse_one_enum<Color>
                 ((detail *)
                  oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_payload,hash,tail_1);
  return (_Optional_base<unsigned_long,_true,_true>)
         (_Optional_base<unsigned_long,_true,_true>)
         _Var2._M_payload.super__Optional_payload_base<unsigned_long>;
}

Assistant:

constexpr optional<std::uintmax_t> fuse_enum(E head, Es... tail) noexcept {
  return fuse_one_enum(fuse_enum(tail...), head);
}